

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

int __thiscall google::protobuf::internal::ExtensionSet::SpaceUsedExcludingSelf(ExtensionSet *this)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  
  iVar3 = (int)(this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_node_count << 5;
  for (p_Var2 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    iVar1 = Extension::SpaceUsedExcludingSelf((Extension *)&p_Var2[1]._M_parent);
    iVar3 = iVar3 + iVar1;
  }
  return iVar3;
}

Assistant:

int ExtensionSet::SpaceUsedExcludingSelf() const {
  int total_size =
      extensions_.size() * sizeof(map<int, Extension>::value_type);
  for (map<int, Extension>::const_iterator iter = extensions_.begin(),
       end = extensions_.end();
       iter != end;
       ++iter) {
    total_size += iter->second.SpaceUsedExcludingSelf();
  }
  return total_size;
}